

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O3

int ON_String::FormatVargsIntoBuffer
              (char *buffer,size_t buffer_capacity,char *format,__va_list_tag *args)

{
  uint uVar1;
  ulong uVar2;
  va_list args_copy;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  uVar1 = 0xffffffff;
  if (buffer_capacity != 0 && buffer != (char *)0x0) {
    *buffer = '\0';
    local_28 = args->reg_save_area;
    local_38._0_4_ = args->gp_offset;
    local_38._4_4_ = args->fp_offset;
    pvStack_30 = args->overflow_arg_area;
    uVar1 = vsnprintf(buffer,buffer_capacity,format,&local_38);
    if (buffer_capacity <= (ulong)(long)(int)uVar1) {
      uVar1 = 0xffffffff;
    }
    uVar2 = 0;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    buffer[uVar2] = '\0';
    buffer[buffer_capacity - 1] = '\0';
  }
  return uVar1;
}

Assistant:

int ON_String::FormatVargsIntoBuffer(
  char* buffer,
  size_t buffer_capacity,
  const char* format,
  va_list args
  )
{
  if (0 == buffer || buffer_capacity <= 0)
    return -1;
  buffer[0] = 0;
#if defined(ON_COMPILER_CLANG) || defined(ON_COMPILER_GNU)
  // CLang modifies args so a copy is required
  va_list args_copy;
  va_copy (args_copy, args);
#if defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  int len = vsnprintf(buffer, buffer_capacity, format, args_copy);
#else
  int len = vsnprintf_l(buffer, buffer_capacity, ON_Locale::Ordinal.NumericLocalePtr(), format, args_copy);
#endif
  va_end(args_copy);
#else
  int len = _vsprintf_p_l(buffer, buffer_capacity, format, ON_Locale::Ordinal.NumericLocalePtr(), args);
#endif
  if (((size_t)len) >= buffer_capacity)
    len = -1;
  buffer[(len <= 0) ? 0 : len] = 0;
  buffer[buffer_capacity - 1] = 0;
  return len;
}